

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Matcher::DoSaveInnerGroups
          (Matcher *this,int fromGroupId,int toGroupId,bool reset,Char *input,ContStack *contStack)

{
  GroupInfo *pGVar1;
  PageAllocation *pPVar2;
  size_t sVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  int local_34;
  
  if (fromGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10b,"(fromGroupId >= 0)","fromGroupId >= 0");
    if (!bVar5) goto LAB_00ef355d;
    *puVar6 = 0;
  }
  if (toGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10c,"(toGroupId >= 0)","toGroupId >= 0");
    if (!bVar5) goto LAB_00ef355d;
    *puVar6 = 0;
  }
  if (toGroupId < fromGroupId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10d,"(fromGroupId <= toGroupId)","fromGroupId <= toGroupId");
    if (!bVar5) goto LAB_00ef355d;
    *puVar6 = 0;
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_34 = -1;
  do {
    if ((fromGroupId < 0) || ((int)(uint)((this->program).ptr)->numGroups <= fromGroupId)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                         "groupId >= 0 && groupId < program->numGroups");
      if (!bVar5) goto LAB_00ef355d;
      *puVar6 = 0;
    }
    pGVar1 = (this->groupInfos).ptr;
    if (pGVar1[fromGroupId].length == 0xffffffff) {
      if (local_34 < 0) {
        local_34 = fromGroupId;
      }
    }
    else {
      if (-1 < local_34) {
        if (fromGroupId < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x11f,"(groupId > 0)","groupId > 0");
          if (!bVar5) goto LAB_00ef355d;
          *puVar6 = 0;
        }
        DoSaveInnerGroups_AllUndefined(this,local_34,fromGroupId + -1,input,contStack);
        local_34 = -1;
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize -
          (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                           ,199,"(bufferSize)","bufferSize");
        if (!bVar5) goto LAB_00ef355d;
        *puVar6 = 0;
      }
      pPVar2 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar3 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar3 + 0x20;
      *(size_t *)((long)&pPVar2[1].pageCount + sVar3) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      *(undefined1 *)((long)&pPVar2[2].pageCount + sVar3) = 2;
      *(undefined ***)((long)&pPVar2[1].segment + sVar3) = &PTR_Print_015597b8;
      *(int *)((long)&pPVar2[2].pageCount + sVar3 + 4) = fromGroupId;
      *(GroupInfo *)((long)&pPVar2[2].segment + sVar3) = pGVar1[fromGroupId];
      PushStats(this,contStack,input);
      if (reset) {
        pGVar1[fromGroupId].length = 0xffffffff;
      }
    }
    fromGroupId = fromGroupId + 1;
  } while (fromGroupId <= toGroupId);
  if (local_34 < 0) {
    return;
  }
  if (toGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x130,"(toGroupId >= 0)","toGroupId >= 0");
    if (!bVar5) {
LAB_00ef355d:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  DoSaveInnerGroups_AllUndefined(this,local_34,toGroupId,input,contStack);
  return;
}

Assistant:

void Matcher::DoSaveInnerGroups(
        const int fromGroupId,
        const int toGroupId,
        const bool reset,
        const Char *const input,
        ContStack &contStack)
    {
        Assert(fromGroupId >= 0);
        Assert(toGroupId >= 0);
        Assert(fromGroupId <= toGroupId);

        int undefinedRangeFromId = -1;
        int groupId = fromGroupId;
        do
        {
            GroupInfo *const groupInfo = GroupIdToGroupInfo(groupId);
            if (groupInfo->IsUndefined())
            {
                if (undefinedRangeFromId < 0)
                {
                    undefinedRangeFromId = groupId;
                }
                continue;
            }

            if (undefinedRangeFromId >= 0)
            {
                Assert(groupId > 0);
                DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, groupId - 1, input, contStack);
                undefinedRangeFromId = -1;
            }

            PUSH(contStack, RestoreGroupCont, groupId, *groupInfo);
#if ENABLE_REGEX_CONFIG_OPTIONS
            PushStats(contStack, input);
#endif

            if (reset)
            {
                groupInfo->Reset();
            }
        } while (++groupId <= toGroupId);
        if (undefinedRangeFromId >= 0)
        {
            Assert(toGroupId >= 0);
            DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, toGroupId, input, contStack);
        }
    }